

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,QByteArrayView data,qsizetype from)

{
  ulong uVar1;
  bool bVar2;
  qsizetype qVar3;
  byte *pbVar4;
  storage_type *psVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  
  psVar5 = data.m_data;
  lVar7 = 0;
  if (0 < from) {
    lVar7 = from;
  }
  uVar1 = (this->field_2).p.l;
  if (uVar1 == 0) {
    qVar3 = -1;
    if (lVar7 <= data.m_size) {
      qVar3 = lVar7;
    }
    return qVar3;
  }
  lVar8 = -uVar1;
  pbVar4 = (byte *)(psVar5 + uVar1 + lVar7 + -1);
  do {
    if (psVar5 + data.m_size <= pbVar4) {
      return -1;
    }
    uVar6 = (ulong)*(byte *)((long)&this->field_2 + (ulong)*pbVar4);
    if (uVar6 == 0) {
      uVar6 = uVar1;
      pbVar9 = pbVar4;
      if ((long)uVar1 < 1) {
        lVar8 = 0;
LAB_00156eb0:
        return (qsizetype)(pbVar4 + (lVar8 - (long)psVar5) + 1);
      }
      while (*pbVar9 == (this->field_2).p.p[uVar6 - 1]) {
        uVar6 = uVar6 - 1;
        pbVar9 = pbVar9 + -1;
        if (uVar6 == 0) goto LAB_00156eb0;
      }
      if (uVar1 != *(byte *)((long)&this->field_2 + (ulong)*pbVar9)) {
        uVar6 = 1;
      }
    }
    bVar2 = psVar5 + data.m_size + -uVar6 < pbVar4;
    pbVar4 = pbVar4 + uVar6;
    if (bVar2) {
      return -1;
    }
  } while( true );
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(QByteArrayView data, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(data.data()), data.size(), from,
                   p.p, p.l, p.q_skiptable);
}